

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_parser_t * mpc_not_lift(mpc_parser_t *a,mpc_dtor_t da,mpc_ctor_t lf)

{
  mpc_parser_t *pmVar1;
  mpc_parser_t *p;
  mpc_ctor_t lf_local;
  mpc_dtor_t da_local;
  mpc_parser_t *a_local;
  
  pmVar1 = mpc_undefined();
  pmVar1->type = '\x12';
  (pmVar1->data).expect.x = a;
  (pmVar1->data).check.dx = da;
  (pmVar1->data).not.lf = lf;
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_not_lift(mpc_parser_t *a, mpc_dtor_t da, mpc_ctor_t lf) {
  mpc_parser_t *p = mpc_undefined();
  p->type = MPC_TYPE_NOT;
  p->data.not.x = a;
  p->data.not.dx = da;
  p->data.not.lf = lf;
  return p;
}